

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void print_board(sparse_array_n<bool,_2,_std::allocator<bool>_> *board,int *m,int *n)

{
  bool *pbVar1;
  uint uVar2;
  char *pcVar3;
  uint d0;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar4 = *m;
  if (uVar4 != 0) {
    uVar2 = *n;
    d0 = 0;
    do {
      bVar6 = uVar2 != 0;
      uVar2 = 0;
      if (bVar6) {
        uVar5 = 0;
        do {
          pbVar1 = sisl::sparse_array_n<bool,_2,_std::allocator<bool>_>::operator()(board,d0,uVar5);
          pcVar3 = "X";
          if (*pbVar1 == false) {
            pcVar3 = " ";
          }
          printf("\x1b[%d;%dH%s\n",(ulong)d0,uVar5,pcVar3);
          uVar4 = (int)uVar5 + 1;
          uVar5 = (ulong)uVar4;
          uVar2 = *n;
        } while (uVar4 < uVar2);
        uVar4 = *m;
      }
      d0 = d0 + 1;
    } while (d0 < uVar4);
  }
  return;
}

Assistant:

void print_board(const sisl::sparse_array_n<bool, 2> &board, const int &m, const int &n) {
	for(uint i = 0; i < m; i++)
		for(uint j = 0; j < n; j++) {
			print_at(
				i,j,
				board(i,j) ? "X" : " "
			);
		}
}